

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O2

void * ps_timer_create_(char *timer_name)

{
  void *pvVar1;
  
  ps_register_thread_internal();
  pvVar1 = calloc((long)num_tools_registered,8);
  if (timer_create_function != (ps_timer_create_t)0x0) {
    pvVar1 = (*timer_create_function)(timer_name);
    return pvVar1;
  }
  return pvVar1;
}

Assistant:

void* ps_timer_create_(const char *timer_name) {
    ps_register_thread_internal();
    void ** objects = (void **)calloc(num_tools_registered, sizeof(void*));
    if (timer_create_function != NULL)
        objects = (void *)timer_create_function(timer_name);
    return (void*)(objects);
}